

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall wallet::SQLiteDatabase::Backup(SQLiteDatabase *this,string *dest)

{
  string_view source_file;
  string_view source_file_00;
  int iVar1;
  char *pcVar2;
  long lVar3;
  LogFlags flag;
  long in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  sqlite3_backup *backup;
  int res;
  sqlite3 *db_copy;
  Level in_stack_000000e0;
  char (*in_stack_000000f0) [7];
  char **in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool local_61;
  LogFlags in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  ConstevalFormatString<2U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar1 = sqlite3_open(pcVar2,&stack0xfffffffffffffff0);
  if (iVar1 == 0) {
    lVar3 = sqlite3_backup_init(in_stack_fffffffffffffff0,"main",*(undefined8 *)(in_RDI + 200));
    if (lVar3 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
      sqlite3_errmsg(*(undefined8 *)(in_RDI + 200));
      source_file._M_str = pcVar4;
      source_file._M_len = in_stack_fffffffffffffff0;
      LogPrintFormatInternal<char[7],char_const*>
                (in_stack_00000000,source_file,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 in_stack_000000e0,in_stack_ffffffffffffffe8,in_stack_000000f0,in_stack_000000f8);
      sqlite3_close(in_stack_fffffffffffffff0);
      local_61 = false;
    }
    else {
      iVar1 = sqlite3_backup_step(lVar3,0xffffffff);
      if (iVar1 == 0x65) {
        iVar1 = sqlite3_backup_finish(lVar3);
        sqlite3_close(in_stack_fffffffffffffff0);
        local_61 = iVar1 == 0;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff50);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff50);
        flag = sqlite3_errstr(iVar1);
        source_file_00._M_str = pcVar4;
        source_file_00._M_len = in_stack_fffffffffffffff0;
        LogPrintFormatInternal<char[7],char_const*>
                  (in_stack_00000000,source_file_00,in_stack_ffffffffffffffac,flag,in_stack_000000e0
                   ,in_stack_ffffffffffffffe8,in_stack_000000f0,in_stack_000000f8);
        sqlite3_backup_finish(lVar3);
        sqlite3_close(in_stack_fffffffffffffff0);
        local_61 = false;
      }
    }
  }
  else {
    sqlite3_close(in_stack_fffffffffffffff0);
    local_61 = false;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar4) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteDatabase::Backup(const std::string& dest) const
{
    sqlite3* db_copy;
    int res = sqlite3_open(dest.c_str(), &db_copy);
    if (res != SQLITE_OK) {
        sqlite3_close(db_copy);
        return false;
    }
    sqlite3_backup* backup = sqlite3_backup_init(db_copy, "main", m_db, "main");
    if (!backup) {
        LogPrintf("%s: Unable to begin backup: %s\n", __func__, sqlite3_errmsg(m_db));
        sqlite3_close(db_copy);
        return false;
    }
    // Specifying -1 will copy all of the pages
    res = sqlite3_backup_step(backup, -1);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to backup: %s\n", __func__, sqlite3_errstr(res));
        sqlite3_backup_finish(backup);
        sqlite3_close(db_copy);
        return false;
    }
    res = sqlite3_backup_finish(backup);
    sqlite3_close(db_copy);
    return res == SQLITE_OK;
}